

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

void __thiscall QAbstractScrollAreaPrivate::layoutChildren(QAbstractScrollAreaPrivate *this)

{
  long in_FS_OFFSET;
  bool needV;
  bool needH;
  bool local_22;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = false;
  local_22 = false;
  layoutChildren_helper(this,&local_21,&local_22);
  if (local_21 != local_22) {
    layoutChildren_helper(this,&local_21,&local_22);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::layoutChildren()
{
    bool needH = false;
    bool needV = false;
    layoutChildren_helper(&needH, &needV);
    // Call a second time if one scrollbar was needed and not the other to
    // check if it needs to readjust accordingly
    if (needH != needV)
        layoutChildren_helper(&needH, &needV);
}